

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this)

{
  string *psVar1;
  FileOptions *this_local;
  
  this->_cached_size_ = 0;
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->java_package_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->java_outer_classname_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->go_package_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->objc_class_prefix_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->csharp_namespace_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->swift_prefix_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->php_class_prefix_,psVar1);
  memset(&this->java_multiple_files_,0,8);
  this->optimize_for_ = 1;
  return;
}

Assistant:

void FileOptions::SharedCtor() {
  _cached_size_ = 0;
  java_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  java_outer_classname_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  go_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  objc_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  csharp_namespace_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  swift_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  php_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&java_multiple_files_, 0, reinterpret_cast<char*>(&cc_enable_arenas_) -
    reinterpret_cast<char*>(&java_multiple_files_) + sizeof(cc_enable_arenas_));
  optimize_for_ = 1;
}